

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

bool point_in_line_segment(int x,int y,int x1,int y1,int x2,int y2,int threshold)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float d;
  float c;
  long b;
  long a;
  int local_30;
  int bottom;
  int top;
  int right;
  int left;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  int y_local;
  int x_local;
  
  bottom = x1;
  top = x2;
  if (x1 < x2) {
    bottom = x2;
    top = x1;
  }
  a._4_4_ = y1;
  local_30 = y2;
  if (y1 < y2) {
    a._4_4_ = y2;
    local_30 = y1;
  }
  if ((((x < top - threshold) || (bottom + threshold < x)) || (y < local_30 - threshold)) ||
     (a._4_4_ + threshold < y)) {
    y_local._3_1_ = false;
  }
  else {
    lVar1 = (long)(y1 - y2);
    lVar2 = (long)(x2 - x1);
    fVar3 = (float)lVar1 * (float)x + (float)lVar2 * (float)y +
            (float)((long)x1 * (long)y2 - (long)x2 * (long)y1);
    y_local._3_1_ =
         fVar3 * fVar3 <=
         (float)((long)threshold * (long)threshold * (lVar1 * lVar1 + lVar2 * lVar2));
  }
  return y_local._3_1_;
}

Assistant:

static bool
point_in_line_segment(int x, int y, int x1, int y1, int x2, int y2,
                      int threshold)
{
  int left, right, top, bottom;
  if (x1 < x2) {
    left = x1;
    right = x2;
  } else {
    left = x2;
    right = x1;
  }
  if (y1 < y2) {
    top = y1;
    bottom = y2;
  } else {
    top = y2;
    bottom = y1;
  }

  // do simple bounding box test first
  if (x < left - threshold || x > right + threshold || y < top - threshold ||
      y > bottom + threshold) {
    return false;
  }

  // The old line hit formula.  Seems to work okay.

  // equation for line is ax + by + c = 0
  // d/sqrt(a^2+b^2) is the distance between line and point <x,y>
  long a = y1 - y2; //long type needed for Windows
  long b = x2 - x1;
  float c = (float)(long(x1) * y2 - long(x2) * y1);
  float d = ((float)a) * x + ((float)b) * y + c;

  return (d * d <= long(threshold) * threshold * (a * a + b * b));
}